

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O3

void __thiscall PrintLanguage::recurse(PrintLanguage *this)

{
  uint4 uVar1;
  int iVar2;
  Varnode *vn;
  PcodeOp *op;
  TypeOp *pTVar3;
  pointer pNVar4;
  int iVar5;
  
  uVar1 = this->mods;
  iVar2 = this->pending;
  pNVar4 = (this->nodepend).
           super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar5 = (int)((ulong)((long)pNVar4 -
                       (long)(this->nodepend).
                             super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  this->pending = iVar5;
  while (iVar2 < iVar5) {
    vn = pNVar4[-1].vn;
    op = pNVar4[-1].op;
    this->mods = pNVar4[-1].vnmod;
    (this->nodepend).
    super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar4 + -1;
    this->pending = iVar5 + -1;
    if ((vn->flags & 0x40) == 0) {
      pushVnExplicit(this,vn,op);
    }
    else {
      pTVar3 = vn->def->opcode;
      (*pTVar3->_vptr_TypeOp[9])(pTVar3,this);
    }
    pNVar4 = (this->nodepend).
             super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = (int)((ulong)((long)pNVar4 -
                         (long)(this->nodepend).
                               super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    this->pending = iVar5;
  }
  this->mods = uVar1;
  return;
}

Assistant:

void PrintLanguage::recurse(void)

{
  uint4 modsave = mods;
  int4 final = pending;		// Already claimed
  pending = nodepend.size();	// Lay claim to the rest
  while(final < pending) {
    const Varnode *vn = nodepend.back().vn;
    const PcodeOp *op = nodepend.back().op;
    mods = nodepend.back().vnmod;
    nodepend.pop_back();
    pending -= 1;
    if (vn->isImplied())
      vn->getDef()->push(this);
    else
      pushVnExplicit(vn,op);
    pending = nodepend.size();
  }
  mods = modsave;
}